

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O1

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  char *pcVar1;
  char cVar2;
  double b;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  double result;
  double local_d38;
  BigInteger local_d30;
  
  if (d < 0.0) {
    __assert_fail("d >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                  ,0xe1,
                  "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
                 );
  }
  if (length == 0) {
    __assert_fail("length >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                  ,0xe2,
                  "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
                 );
  }
  if (p - 0x17U < 0xf) {
    if (0x134 < p - 0x16U) goto LAB_0047e85d;
    d = d * *(double *)(Pow10(int)::e + (ulong)(p - 0x16U) * 8);
    p = 0x16;
  }
  bVar5 = p + 0x16U < 0x2d;
  if (d <= 9007199254740991.0 && bVar5) {
    local_d38 = 0.0;
    if (-0x135 < p) {
      if (p < 0) {
        if (0x134 < (uint)-p) goto LAB_0047e85d;
        local_d38 = d / *(double *)(Pow10(int)::e + (ulong)(uint)-p * 8);
      }
      else {
        if (0x134 < (uint)p) {
LAB_0047e85d:
          __assert_fail("n >= 0 && n <= 308",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/pow10.h"
                        ,0x30,"double rapidjson::internal::Pow10(int)");
        }
        local_d38 = d * *(double *)(Pow10(int)::e + (ulong)(uint)p * 8);
      }
    }
    if (d <= 9007199254740991.0 && bVar5) {
      return local_d38;
    }
  }
  if (length != 1 && *decimals == '0') {
    do {
      length = length - 1;
      decimalPosition = decimalPosition - 1;
      pcVar1 = decimals + 1;
      decimals = decimals + 1;
      if (*pcVar1 != '0') break;
    } while (1 < length);
  }
  if (1 < length) {
    cVar2 = decimals[length - 1];
    uVar3 = length;
    while (length = uVar3, cVar2 == '0') {
      length = uVar3 - 1;
      decimalPosition = decimalPosition - 1;
      exp = exp + 1;
      if (length < 2) break;
      cVar2 = decimals[uVar3 - 2];
      uVar3 = length;
    }
  }
  uVar3 = 0;
  if (0x30c < (int)length) {
    uVar3 = (ulong)((int)length - 0x30c);
    length = 0x30c;
  }
  iVar4 = exp + (int)uVar3;
  b = 0.0;
  if (-0x145 < iVar4 + (int)length) {
    bVar5 = StrtodDiyFp(decimals,length,decimalPosition - uVar3,iVar4,&local_d38);
    b = local_d38;
    if (!bVar5) {
      BigInteger::BigInteger(&local_d30,decimals,length);
      iVar4 = CheckWithinHalfULP(b,&local_d30,(iVar4 - (int)length) + (int)(decimalPosition - uVar3)
                                );
      if ((-1 < iVar4) && ((iVar4 != 0 || (((ulong)b & 1) != 0)))) {
        if ((long)b < 0) {
          __assert_fail("!Sign()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/ieee754.h"
                        ,0x21,"double rapidjson::internal::Double::NextPositiveDouble() const");
        }
        b = (double)((long)b + 1);
      }
    }
  }
  return b;
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    RAPIDJSON_ASSERT(d >= 0.0);
    RAPIDJSON_ASSERT(length >= 1);

    double result;
    if (StrtodFast(d, p, &result))
        return result;

    // Trim leading zeros
    while (*decimals == '0' && length > 1) {
        length--;
        decimals++;
        decimalPosition--;
    }

    // Trim trailing zeros
    while (decimals[length - 1] == '0' && length > 1) {
        length--;
        decimalPosition--;
        exp++;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 780;
    if (static_cast<int>(length) > kMaxDecimalDigit) {
        int delta = (static_cast<int>(length) - kMaxDecimalDigit);
        exp += delta;
        decimalPosition -= static_cast<unsigned>(delta);
        length = kMaxDecimalDigit;
    }

    // If too small, underflow to zero
    if (int(length) + exp < -324)
        return 0.0;

    if (StrtodDiyFp(decimals, length, decimalPosition, exp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, length, decimalPosition, exp);
}